

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.hxx
# Opt level: O0

string * __thiscall
Physical::getPhysicalDescription_abi_cxx11_(string *__return_storage_ptr__,Physical *this)

{
  Physical *this_local;
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&this->physicalDescription);
  return __return_storage_ptr__;
}

Assistant:

virtual string getPhysicalDescription() { 
		return physicalDescription;
	}